

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DTDValidator::validateAttrValue
          (DTDValidator *this,XMLAttDef *attDef,XMLCh *attrValue,bool preValidation,
          XMLElementDecl *param_4)

{
  byte bVar1;
  bool bVar2;
  XMLCh XVar3;
  AttTypes AVar4;
  DefAttTypes DVar5;
  XMLCh *enumList;
  XMLScanner *pXVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  XMLSize_t XVar9;
  XMLCh *pXVar10;
  undefined4 extraout_var_00;
  DTDEntityDecl *pDVar11;
  undefined4 extraout_var_01;
  XMLCh *text1_00;
  ulong uVar12;
  Codes toEmit;
  XMLCh *text1_01;
  XMLRefInfo *local_138;
  ArrayJanitor<char16_t> janTmpVal;
  XMLCh tempBuffer [100];
  XMLCh *text1;
  
  AVar4 = attDef->fType;
  DVar5 = attDef->fDefaultType;
  pXVar10 = attDef->fValue;
  iVar8 = (*(attDef->super_XSerializable)._vptr_XSerializable[5])(attDef);
  text1 = (XMLCh *)CONCAT44(extraout_var,iVar8);
  enumList = attDef->fEnumeration;
  bVar2 = attDef->fExternalAttribute;
  if ((DVar5 == Fixed && !preValidation) && (bVar7 = XMLString::equals(attrValue,pXVar10), !bVar7))
  {
    XMLValidator::emitError
              (&this->super_XMLValidator,NotSameAsFixedValue,text1,attrValue,pXVar10,(XMLCh *)0x0);
  }
  if (AVar4 != AttTypes_Min) {
    if (*attrValue == L'\0') {
      XMLValidator::emitError
                (&this->super_XMLValidator,InvalidEmptyAttValue,text1,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
      return;
    }
    ArrayJanitor<char16_t>::ArrayJanitor(&janTmpVal,(char16_t *)0x0);
    XVar9 = XMLString::stringLen(attrValue);
    if (XVar9 < 100) {
      pXVar10 = tempBuffer;
      XMLString::copyString(pXVar10,attrValue);
    }
    else {
      pXVar10 = XMLString::replicate
                          (attrValue,((this->super_XMLValidator).fScanner)->fMemoryManager);
      ArrayJanitor<char16_t>::reset
                (&janTmpVal,pXVar10,((this->super_XMLValidator).fScanner)->fMemoryManager);
      pXVar10 = ArrayJanitor<char16_t>::get(&janTmpVal);
    }
    bVar1 = (uint)AVar4 < 10 & (byte)(0x3a8 >> ((byte)AVar4 & 0x1f));
    if ((bVar1 != 0) &&
       ((pXVar6 = (this->super_XMLValidator).fScanner, bVar2 == false ||
        (pXVar6->fStandalone == false)))) {
      XMLString::collapseWS(pXVar10,pXVar6->fMemoryManager);
    }
    bVar2 = ((this->super_XMLValidator).fScanner)->fDoNamespaces;
    do {
      text1_01 = pXVar10;
      if (((uint)AVar4 < 9) && ((0x13fU >> (AVar4 & 0x1f) & 1) != 0)) {
        if ((((this->super_XMLValidator).fReaderMgr)->fCurReader->fgCharCharsTable[(ushort)*pXVar10]
            & 2) == 0) {
          XMLValidator::emitError
                    (&this->super_XMLValidator,AttrValNotName,pXVar10,text1,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        text1_01 = pXVar10 + 1;
      }
      while( true ) {
        XVar3 = *text1_01;
        uVar12 = (ulong)(ushort)XVar3;
        if (XVar3 == L'\0') break;
        if (XVar3 == L' ') {
          if (bVar1 == 0) {
            XMLValidator::emitError
                      (&this->super_XMLValidator,NoMultipleValues,text1,(XMLCh *)0x0,(XMLCh *)0x0,
                       (XMLCh *)0x0);
            goto LAB_002fbf70;
          }
          break;
        }
        if ((((XVar3 == L':') && (bVar2 != false)) && (uVar12 = 0x3a, (uint)AVar4 < 9)) &&
           ((0x13fU >> (AVar4 & 0x1f) & 1) != 0)) {
          XMLValidator::emitError(&this->super_XMLValidator,ColonNotValidWithNS);
          uVar12 = (ulong)(ushort)*text1_01;
        }
        if ((((this->super_XMLValidator).fReaderMgr)->fCurReader->fgCharCharsTable[uVar12] & 4) == 0
           ) {
          XMLValidator::emitError
                    (&this->super_XMLValidator,AttrValNotName,text1_01,text1,(XMLCh *)0x0,
                     (XMLCh *)0x0);
          goto LAB_002fbf70;
        }
        text1_01 = text1_01 + 1;
      }
      *text1_01 = L'\0';
      if ((uint)AVar4 < 4) {
        iVar8 = (*((this->super_XMLValidator).fScanner)->fValidationContext->_vptr_ValidationContext
                  [2])();
        local_138 = RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::get
                              ((RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *
                               )CONCAT44(extraout_var_00,iVar8),pXVar10);
        if (local_138 == (XMLRefInfo *)0x0) {
          local_138 = (XMLRefInfo *)
                      XMemory::operator_new
                                (0x20,((this->super_XMLValidator).fScanner)->fMemoryManager);
          XMLRefInfo::XMLRefInfo
                    (local_138,pXVar10,false,false,
                     ((this->super_XMLValidator).fScanner)->fMemoryManager);
          iVar8 = (*((this->super_XMLValidator).fScanner)->fValidationContext->
                    _vptr_ValidationContext[2])();
          RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::put
                    ((RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)
                     CONCAT44(extraout_var_01,iVar8),local_138->fRefName,local_138);
LAB_002fbf0a:
          if (AVar4 != ID) {
            if (!preValidation) {
              local_138->fUsed = true;
            }
            goto LAB_002fbf3e;
          }
        }
        else {
          if ((AVar4 != ID) || (local_138->fDeclared == false)) goto LAB_002fbf0a;
          XMLValidator::emitError
                    (&this->super_XMLValidator,ReusedIDValue,pXVar10,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        local_138->fDeclared = true;
      }
      else if ((AVar4 & ~ID) == Entity && !preValidation) {
        pDVar11 = DTDGrammar::getEntityDecl(this->fDTDGrammar,pXVar10);
        if (pDVar11 == (DTDEntityDecl *)0x0) {
          toEmit = UnknownEntityRefAttr;
          text1_00 = text1;
        }
        else {
          toEmit = BadEntityRefAttr;
          text1_00 = pXVar10;
          pXVar10 = text1;
          if ((pDVar11->super_XMLEntityDecl).fNotationName != (XMLCh *)0x0) goto LAB_002fbf3e;
        }
        XMLValidator::emitError
                  (&this->super_XMLValidator,toEmit,text1_00,pXVar10,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      else if (((AVar4 & ~ID) == Notation) &&
              (bVar7 = XMLString::isInList(pXVar10,enumList), !bVar7)) {
        XMLValidator::emitError
                  (&this->super_XMLValidator,DoesNotMatchEnumList,pXVar10,text1,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
LAB_002fbf3e:
      pXVar10 = text1_01 + 1;
    } while ((bVar1 & XVar3 != L'\0') != 0);
LAB_002fbf70:
    ArrayJanitor<char16_t>::~ArrayJanitor(&janTmpVal);
  }
  return;
}

Assistant:

void
DTDValidator::validateAttrValue(const   XMLAttDef*      attDef
                                , const XMLCh* const    attrValue
                                , bool                  preValidation
                                , const XMLElementDecl*)
{
    //
    //  Get quick refs to lost of of the stuff in the passed objects in
    //  order to simplify the code below, which will reference them very
    //  often.
    //
    const XMLAttDef::AttTypes       type = attDef->getType();
    const XMLAttDef::DefAttTypes    defType = attDef->getDefaultType();
    const XMLCh* const              valueText = attDef->getValue();
    const XMLCh* const              fullName = attDef->getFullName();
    const XMLCh* const              enumList = attDef->getEnumeration();
    const bool                      isExternal = attDef->isExternal();

    //
    //  If the default type is fixed, then make sure the passed value maps
    //  to the fixed value.
    //  If during preContentValidation, the value we are validating is the fixed value itself
    //  so no need to compare.
    //  Only need to do this for regular attribute value validation
    //
    if (defType == XMLAttDef::Fixed && !preValidation)
    {
        if (!XMLString::equals(attrValue, valueText))
            emitError(XMLValid::NotSameAsFixedValue, fullName, attrValue, valueText);
    }

    //
    //  If its a CDATA attribute, then we are done with any DTD level
    //  validation else do the rest.
    //
    if (type == XMLAttDef::CData)
        return;



    // An empty string cannot be valid for any of the other types
    if (!attrValue[0])
    {
        emitError(XMLValid::InvalidEmptyAttValue, fullName);
        return;
    }

    // See whether we are doing multiple values or not
    const bool multipleValues =
    (
        (type == XMLAttDef::IDRefs)
        || (type == XMLAttDef::Entities)
        || (type == XMLAttDef::NmTokens)
        || (type == XMLAttDef::Notation)
        || (type == XMLAttDef::Enumeration)
    );

    // And whether we must check for a first name char
    const bool firstNameChar =
    (
        (type == XMLAttDef::ID)
        || (type == XMLAttDef::IDRef)
        || (type == XMLAttDef::IDRefs)
        || (type == XMLAttDef::Entity)
        || (type == XMLAttDef::Entities)
        || (type == XMLAttDef::Notation)
    );

    // Whether it requires ref checking stuff
    const bool isARefType
    (
        (type == XMLAttDef::ID)
        || (type == XMLAttDef::IDRef)
        || (type == XMLAttDef::IDRefs)
    );

    // Some trigger flags to avoid issuing redundant errors and whatnot    
    bool alreadyCapped = false;

    //
    //  Make a copy of the text that we can mangle and get a pointer we can
    //  move through the value
    //

    // Use a stack-based buffer, when possible...
    XMLCh   tempBuffer[100];

    XMLCh* pszTmpVal = 0;

    ArrayJanitor<XMLCh> janTmpVal(0);

    if (XMLString::stringLen(attrValue) < sizeof(tempBuffer) / sizeof(tempBuffer[0]))
    {
        XMLString::copyString(tempBuffer, attrValue);
        pszTmpVal = tempBuffer;
    }
    else
    {
        janTmpVal.reset(XMLString::replicate(attrValue, getScanner()->getMemoryManager()), getScanner()->getMemoryManager());
        pszTmpVal = janTmpVal.get();
    }

    //  if the type is an enumeration, normalize it, unless standalone = yes is specified
    //  "The standalone document declaration MUST have the value "no" if any external markup declarations contain declarations of:
    //   - ...
    //   - attributes with tokenized types, where the attribute appears in the document with a value such that normalization will 
    //     produce a different value from that which would be produced in the absence of the declaration"
    if (multipleValues && (!isExternal || !getScanner()->getStandalone()))
        XMLString::collapseWS(pszTmpVal, getScanner()->getMemoryManager());

    XMLCh* valPtr = pszTmpVal;

    bool doNamespace = getScanner()->getDoNamespaces();

    while (true)
    {
        //
        //  Make sure the first character is a valid first name char, i.e.
        //  if its a Name value. For NmToken values we don't treat the first
        //  char any differently.
        //
        if (firstNameChar)
        {
            // If its not, emit and error but try to keep going
            if (!getReaderMgr()->getCurrentReader()->isFirstNameChar(*valPtr))
                emitError(XMLValid::AttrValNotName, valPtr, fullName);
            valPtr++;
        }

        // Make sure all the remaining chars are valid name chars
        while (*valPtr)
        {
            //
            //  If we hit a whitespace, its either a break between two
            //  or more values, or an error if we have a single value.
            //
            //
            //   XML1.0-3rd
            //
            //   [6]   Names   ::=   Name (#x20 Name)*
            //   [8]   Nmtokens   ::=   Nmtoken (#x20 Nmtoken)*
            //
            //   only and only ONE #x20 is allowed to be the delimiter
            //
            if (*valPtr==chSpace)
            {
                if (!multipleValues)
                {
                    emitError(XMLValid::NoMultipleValues, fullName);
                    return;
                }

                break;
            }

            // Now this attribute can be of type
            //     ID, IDREF, IDREFS, ENTITY, ENTITIES, NOTATION, NMTOKEN, NMTOKENS, ENUMERATION
            //  All these must be valid XMLName
            // If namespace is enabled, colon is not allowed in the first 6

            if (doNamespace && *valPtr == chColon && firstNameChar)
                emitError(XMLValid::ColonNotValidWithNS);

            if (!getReaderMgr()->getCurrentReader()->isNameChar(*valPtr))
            {
                emitError(XMLValid::AttrValNotName, valPtr, fullName);
                return;
            }
            valPtr++;
        }

        //
        //  Cap it off at the current non-name char. If already capped,
        //  then remember this.
        //
        if (!(*valPtr))
            alreadyCapped = true;
        *valPtr = 0;

        //
        //  If this type of attribute requires that we track reference
        //  stuff, then handle that.
        //
        if (isARefType)
        {
            if ((type == XMLAttDef::ID)
            ||  (type == XMLAttDef::IDRef)
            ||  (type == XMLAttDef::IDRefs))
            {
                XMLRefInfo* find = getScanner()->getIDRefList()->get(pszTmpVal);
                if (find)
                {
                    if (find->getDeclared() && (type == XMLAttDef::ID))
                        emitError(XMLValid::ReusedIDValue, pszTmpVal);
                }
                 else
                {
                    find = new (getScanner()->getMemoryManager()) XMLRefInfo
                    (
                        pszTmpVal
                        , false
                        , false
                        , getScanner()->getMemoryManager()
                    );
                    getScanner()->getIDRefList()->put((void*)find->getRefName(), find);
                }

                //
                //  Mark it declared or used, which might be redundant in some cases
                //  but not worth checking
                //
                if (type == XMLAttDef::ID)
                    find->setDeclared(true);
                else {
                    if (!preValidation) {
                        find->setUsed(true);
                    }
                }
            }
        }
         else if (!preValidation && ((type == XMLAttDef::Entity) || (type == XMLAttDef::Entities)))
        {
            //
            //  If its refering to a entity, then look up the name in the
            //  general entity pool. If not there, then its an error. If its
            //  not an external unparsed entity, then its an error.
            //
            //  In case of pre-validation, the above errors should be ignored.
            //
            const XMLEntityDecl* decl = fDTDGrammar->getEntityDecl(pszTmpVal);
            if (decl)
            {
                if (!decl->isUnparsed())
                    emitError(XMLValid::BadEntityRefAttr, pszTmpVal, fullName);
            }
             else
            {
                emitError
                (
                    XMLValid::UnknownEntityRefAttr
                    , fullName
                    , pszTmpVal
                );
            }
        }
         else if ((type == XMLAttDef::Notation) || (type == XMLAttDef::Enumeration))
        {
            //
            //  Make sure that this value maps to one of the enumeration or
            //  notation values in the enumList parameter. We don't have to
            //  look it up in the notation pool (if a notation) because we
            //  will look up the enumerated values themselves. If they are in
            //  the notation pool (after the DTD is parsed), then obviously
            //  this value will be legal since it matches one of them.
            //
            if (!XMLString::isInList(pszTmpVal, enumList))
                emitError(XMLValid::DoesNotMatchEnumList, pszTmpVal, fullName);
        }

        // If not doing multiple values, then we are done
        if (!multipleValues)
            break;

        //
        //  If we are at the end, then break out now, else move up to the
        //  next char and update the base pointer.
        //
        if (alreadyCapped)
            break;

        valPtr++;
        pszTmpVal = valPtr;
    }

}